

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

ostream * Json::operator<<(ostream *sout,Value *root)

{
  size_t in_RCX;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  StyledStreamWriter writer;
  Value *root_local;
  ostream *sout_local;
  
  writer._104_8_ = root;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"\t",&local_a9);
  StyledStreamWriter::StyledStreamWriter((StyledStreamWriter *)local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  StyledStreamWriter::write((StyledStreamWriter *)local_88,(int)sout,(void *)writer._104_8_,in_RCX);
  StyledStreamWriter::~StyledStreamWriter((StyledStreamWriter *)local_88);
  return sout;
}

Assistant:

std::ostream& operator<<( std::ostream &sout, const Value &root )
{
   Json::StyledStreamWriter writer;
   writer.write(sout, root);
   return sout;
}